

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_host_buffer.cpp
# Opt level: O3

shared_host_buffer * __thiscall
gpu::shared_host_buffer::operator=(shared_host_buffer *this,shared_host_buffer *other)

{
  long *plVar1;
  
  if (this != other) {
    decref(this);
    plVar1 = (long *)other->buffer_;
    this->buffer_ = (uchar *)plVar1;
    this->data_ = other->data_;
    this->type_ = other->type_;
    this->size_ = other->size_;
    if (plVar1 != (long *)0x0) {
      LOCK();
      *plVar1 = *plVar1 + 1;
      UNLOCK();
    }
  }
  return this;
}

Assistant:

shared_host_buffer &shared_host_buffer::operator= (const shared_host_buffer &other)
{
	if (this != &other) {
		decref();
		buffer_	= other.buffer_;
		data_	= other.data_;
		type_	= other.type_;
		size_	= other.size_;
		incref();
	}

	return *this;
}